

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::truncated_normal_dist<double>::operator()(truncated_normal_dist<double> *this,lcg64_shift *r)

{
  result_type_conflict2 in_RDI;
  result_type_conflict2 rVar1;
  truncated_normal_dist<double> *unaff_retaddr;
  
  utility::uniformoo<double,trng::lcg64_shift>((lcg64_shift *)0x33f761);
  rVar1 = icdf(unaff_retaddr,in_RDI);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf(utility::uniformoo<result_type>(r));
    }